

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O0

void screen_init(void)

{
  int iVar1;
  XRRScreenSize *pXVar2;
  long lVar3;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  int local_4c;
  int mm_2;
  int i_1;
  int mm_1;
  int i;
  XineramaScreenInfo *xsi;
  int mm;
  XRRScreenSize *ssize;
  long lStack_20;
  int nscreens;
  void *libxrandr_addr;
  float local_10;
  float dpiv;
  float dpih;
  int dpi_by_randr;
  
  if (fl_display == (Display *)0x0) {
    fl_open_display();
  }
  dpiv = 0.0;
  local_10 = 0.0;
  libxrandr_addr._4_4_ = 0.0;
  if (screen_init::XRRSizes_f == (XRRSizes_type)0x0) {
    lStack_20 = dlopen("libXrandr.so.2",1);
    if (lStack_20 == 0) {
      lStack_20 = dlopen("libXrandr.so",1);
    }
    if (lStack_20 != 0) {
      screen_init::XRRSizes_f = (XRRSizes_type)dlsym(lStack_20,"XRRSizes");
    }
  }
  if ((screen_init::XRRSizes_f != (XRRSizes_type)0x0) &&
     (pXVar2 = (*screen_init::XRRSizes_f)(fl_display,fl_screen,(int *)((long)&ssize + 4)),
     0 < ssize._4_4_)) {
    if (pXVar2->mwidth == 0) {
      local_54 = 0.0;
    }
    else {
      local_54 = ((float)pXVar2->width * 25.4) / (float)pXVar2->mwidth;
    }
    local_10 = local_54;
    if (pXVar2->mheight == 0) {
      local_58 = 0.0;
    }
    else {
      local_58 = ((float)pXVar2->height * 25.4) / (float)pXVar2->mheight;
    }
    libxrandr_addr._4_4_ = local_58;
    dpiv = 1.4013e-45;
  }
  iVar1 = XineramaIsActive(fl_display);
  if (iVar1 == 0) {
    num_screens = *(int *)(fl_display + 0xe4);
    if (0x10 < num_screens) {
      num_screens = 0x10;
    }
    for (local_4c = 0; local_4c < num_screens; local_4c = local_4c + 1) {
      screens[local_4c].x_org = 0;
      screens[local_4c].y_org = 0;
      screens[local_4c].width =
           (short)*(undefined4 *)(*(long *)(fl_display + 0xe8) + (long)local_4c * 0x80 + 0x18);
      screens[local_4c].height =
           (short)*(undefined4 *)(*(long *)(fl_display + 0xe8) + (long)local_4c * 0x80 + 0x1c);
      if (dpiv == 0.0) {
        iVar1 = *(int *)(*(long *)(fl_display + 0xe8) + (long)local_4c * 0x80 + 0x20);
        if (iVar1 == 0) {
          local_64 = 0.0;
        }
        else {
          local_64 = ((float)(int)screens[local_4c].width * 25.4) / (float)iVar1;
        }
        dpi[local_4c][0] = local_64;
        iVar1 = *(int *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x24);
        if (iVar1 == 0) {
          local_68 = 0.0;
        }
        else {
          local_68 = ((float)(int)screens[local_4c].height * 25.4) / (float)iVar1;
        }
        dpi[local_4c][1] = local_68;
      }
      else {
        dpi[local_4c][0] = local_10;
        dpi[local_4c][1] = libxrandr_addr._4_4_;
      }
    }
  }
  else {
    lVar3 = XineramaQueryScreens(fl_display,&num_screens);
    if (0x10 < num_screens) {
      num_screens = 0x10;
    }
    for (i_1 = 0; i_1 < num_screens; i_1 = i_1 + 1) {
      screens[i_1].x_org = *(short *)(lVar3 + (long)i_1 * 0xc + 4);
      screens[i_1].y_org = *(short *)(lVar3 + (long)i_1 * 0xc + 6);
      screens[i_1].width = *(short *)(lVar3 + (long)i_1 * 0xc + 8);
      screens[i_1].height = *(short *)(lVar3 + (long)i_1 * 0xc + 10);
      if (dpiv == 0.0) {
        iVar1 = *(int *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x20);
        if (iVar1 == 0) {
          local_5c = 0.0;
        }
        else {
          local_5c = ((float)(int)screens[i_1].width * 25.4) / (float)iVar1;
        }
        dpi[i_1][0] = local_5c;
        iVar1 = *(int *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x24);
        if (iVar1 == 0) {
          local_60 = 0.0;
        }
        else {
          local_60 = ((float)(int)screens[i_1].height * 25.4) / (float)iVar1;
        }
        dpi[i_1][1] = local_60;
      }
      else {
        dpi[i_1][0] = local_10;
        dpi[i_1][1] = libxrandr_addr._4_4_;
      }
    }
    if (lVar3 != 0) {
      XFree(lVar3);
    }
  }
  return;
}

Assistant:

static void screen_init() {
  if (!fl_display) fl_open_display();

  int dpi_by_randr = 0;
  float dpih = 0.0f, dpiv = 0.0f;

#if USE_XRANDR

  static XRRSizes_type XRRSizes_f = NULL;
  if (!XRRSizes_f) {
    void *libxrandr_addr = dlopen("libXrandr.so.2", RTLD_LAZY);
    if (!libxrandr_addr) libxrandr_addr = dlopen("libXrandr.so", RTLD_LAZY);
#   ifdef __APPLE_CC__ // allows testing on Darwin + X11
    if (!libxrandr_addr) libxrandr_addr = dlopen("/opt/X11/lib/libXrandr.dylib", RTLD_LAZY);
#   endif
    if (libxrandr_addr) XRRSizes_f = (XRRSizes_type)dlsym(libxrandr_addr, "XRRSizes");
  }
  if (XRRSizes_f) {
    int nscreens;
    XRRScreenSize *ssize = XRRSizes_f(fl_display, fl_screen, &nscreens);

    //for (int i=0; i<nscreens; i++)
    //  printf("width=%d height=%d mwidth=%d mheight=%d\n",
    //         ssize[i].width,ssize[i].height,ssize[i].mwidth,ssize[i].mheight);

    if (nscreens > 0) { // Note: XRRSizes() *may* return nscreens == 0, see docs
      int mm = ssize[0].mwidth;
      dpih = mm ? ssize[0].width*25.4f/mm : 0.0f;
      mm = ssize[0].mheight;
      dpiv = mm ? ssize[0].height*25.4f/mm : 0.0f;
      dpi_by_randr = 1;
    }
  }

#endif // USE_XRANDR

#if HAVE_XINERAMA

  if (XineramaIsActive(fl_display)) {
    XineramaScreenInfo *xsi = XineramaQueryScreens(fl_display, &num_screens);
    if (num_screens > MAX_SCREENS) num_screens = MAX_SCREENS;

    /* There's no way to use different DPI for different Xinerama screens. */
    for (int i=0; i<num_screens; i++) {
      screens[i].x_org = xsi[i].x_org;
      screens[i].y_org = xsi[i].y_org;
      screens[i].width = xsi[i].width;
      screens[i].height = xsi[i].height;

      if (dpi_by_randr) {
	dpi[i][0] = dpih;
	dpi[i][1] = dpiv;
      } else {
        int mm = DisplayWidthMM(fl_display, fl_screen);
        dpi[i][0] = mm ? screens[i].width*25.4f/mm : 0.0f;
        mm = DisplayHeightMM(fl_display, fl_screen);
        dpi[i][1] = mm ? screens[i].height*25.4f/mm : 0.0f;
      }
    }
    if (xsi) XFree(xsi);
  } else

#endif // HAVE_XINERAMA

  { // ! HAVE_XINERAMA || ! XineramaIsActive()
    num_screens = ScreenCount(fl_display);
    if (num_screens > MAX_SCREENS) num_screens = MAX_SCREENS;

    for (int i=0; i<num_screens; i++) {
      screens[i].x_org = 0;
      screens[i].y_org = 0;
      screens[i].width = DisplayWidth(fl_display, i);
      screens[i].height = DisplayHeight(fl_display, i);

      if (dpi_by_randr) {
	dpi[i][0] = dpih;
	dpi[i][1] = dpiv;
      } else {
	int mm = DisplayWidthMM(fl_display, i);
	dpi[i][0] = mm ? screens[i].width*25.4f/mm : 0.0f;
	mm = DisplayHeightMM(fl_display, fl_screen);
	dpi[i][1] = mm ? screens[i].height*25.4f/mm : 0.0f;
      }
    }
  }
}